

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::RandomFragmentOpCase::deinit(RandomFragmentOpCase *this)

{
  QuadRenderer *this_00;
  TextureLevel *pTVar1;
  RandomFragmentOpCase *this_local;
  
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
    operator_delete(this_00,0x20);
  }
  pTVar1 = this->m_refColorBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
    operator_delete(pTVar1,0x28);
  }
  pTVar1 = this->m_refDepthBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
    operator_delete(pTVar1,0x28);
  }
  pTVar1 = this->m_refStencilBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
    operator_delete(pTVar1,0x28);
  }
  if (this->m_refRenderer != (ReferenceQuadRenderer *)0x0) {
    operator_delete(this->m_refRenderer,0x11108);
  }
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  this->m_refDepthBuffer = (TextureLevel *)0x0;
  this->m_refStencilBuffer = (TextureLevel *)0x0;
  this->m_refRenderer = (ReferenceQuadRenderer *)0x0;
  return;
}

Assistant:

void RandomFragmentOpCase::deinit (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;

	m_renderer			= DE_NULL;
	m_refColorBuffer	= DE_NULL;
	m_refDepthBuffer	= DE_NULL;
	m_refStencilBuffer	= DE_NULL;
	m_refRenderer		= DE_NULL;
}